

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

void xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaIDCAugPtr pxVar1;
  xmlSchemaPSVIIDCNodePtr pxVar2;
  xmlSchemaPSVIIDCKeyPtr pxVar3;
  xmlSchemaValPtr value;
  xmlSchemaIDCMatcherPtr pxVar4;
  xmlSchemaIDCMatcherPtr pxVar5;
  void *pvVar6;
  int iVar7;
  xmlDictPtr pxVar8;
  xmlSchemaIDCAugPtr_conflict pxVar9;
  xmlSchemaPSVIIDCNodePtr *ppxVar10;
  xmlSchemaPSVIIDCKeyPtr *ppxVar11;
  xmlSchemaPSVIIDCKeyPtr **pppxVar12;
  xmlSchemaItemListPtr pxVar13;
  long lVar14;
  xmlSchemaIDCMatcherPtr_conflict pxVar15;
  
  if ((vctxt->xsiAssemble != 0) && (vctxt->schema != (xmlSchemaPtr)0x0)) {
    xmlSchemaFree(vctxt->schema);
    vctxt->schema = (xmlSchemaPtr)0x0;
  }
  vctxt->flags = 0;
  vctxt->validationRoot = (xmlNodePtr)0x0;
  vctxt->doc = (xmlDocPtr)0x0;
  vctxt->reader = (xmlTextReaderPtr)0x0;
  vctxt->hasKeyrefs = 0;
  if (vctxt->value != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(vctxt->value);
    vctxt->value = (xmlSchemaValPtr)0x0;
  }
  pxVar9 = vctxt->aidcs;
  if (pxVar9 != (xmlSchemaIDCAugPtr_conflict)0x0) {
    do {
      pxVar1 = pxVar9->next;
      (*xmlFree)(pxVar9);
      pxVar9 = pxVar1;
    } while (pxVar1 != (xmlSchemaIDCAugPtr)0x0);
    vctxt->aidcs = (xmlSchemaIDCAugPtr_conflict)0x0;
  }
  ppxVar10 = vctxt->idcNodes;
  if (ppxVar10 != (xmlSchemaPSVIIDCNodePtr *)0x0) {
    if (0 < vctxt->nbIdcNodes) {
      lVar14 = 0;
      do {
        pxVar2 = vctxt->idcNodes[lVar14];
        (*xmlFree)(pxVar2->keys);
        (*xmlFree)(pxVar2);
        lVar14 = lVar14 + 1;
      } while (lVar14 < vctxt->nbIdcNodes);
      ppxVar10 = vctxt->idcNodes;
    }
    (*xmlFree)(ppxVar10);
    vctxt->idcNodes = (xmlSchemaPSVIIDCNodePtr *)0x0;
    vctxt->nbIdcNodes = 0;
    vctxt->sizeIdcNodes = 0;
  }
  ppxVar11 = vctxt->idcKeys;
  if (ppxVar11 != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
    pppxVar12 = &vctxt->idcKeys;
    if (0 < vctxt->nbIdcKeys) {
      lVar14 = 0;
      do {
        pxVar3 = (*pppxVar12)[lVar14];
        value = pxVar3->val;
        if (value != (xmlSchemaValPtr)0x0) {
          xmlSchemaFreeValue(value);
        }
        (*xmlFree)(pxVar3);
        lVar14 = lVar14 + 1;
      } while (lVar14 < vctxt->nbIdcKeys);
      ppxVar11 = *pppxVar12;
    }
    (*xmlFree)(ppxVar11);
    *pppxVar12 = (xmlSchemaPSVIIDCKeyPtr *)0x0;
    vctxt->nbIdcKeys = 0;
    vctxt->sizeIdcKeys = 0;
  }
  if (vctxt->xpathStates != (xmlSchemaIDCStateObjPtr_conflict)0x0) {
    xmlSchemaFreeIDCStateObjList(vctxt->xpathStates);
    vctxt->xpathStates = (xmlSchemaIDCStateObjPtr_conflict)0x0;
  }
  if (vctxt->nbAttrInfos != 0) {
    xmlSchemaClearAttrInfos(vctxt);
  }
  if ((vctxt->elemInfos != (xmlSchemaNodeInfoPtr *)0x0) && (0 < vctxt->sizeElemInfos)) {
    lVar14 = 0;
    do {
      if (vctxt->elemInfos[lVar14] == (xmlSchemaNodeInfoPtr)0x0) break;
      xmlSchemaClearElemInfo(vctxt,vctxt->elemInfos[lVar14]);
      lVar14 = lVar14 + 1;
    } while (lVar14 < vctxt->sizeElemInfos);
  }
  pxVar13 = vctxt->nodeQNames;
  if (pxVar13->items != (void **)0x0) {
    (*xmlFree)(pxVar13->items);
    pxVar13->items = (void **)0x0;
  }
  pxVar13->nbItems = 0;
  pxVar13->sizeItems = 0;
  xmlDictFree(vctxt->dict);
  pxVar8 = xmlDictCreate();
  vctxt->dict = pxVar8;
  if (vctxt->filename != (char *)0x0) {
    (*xmlFree)(vctxt->filename);
    vctxt->filename = (char *)0x0;
  }
  pxVar15 = vctxt->idcMatcherCache;
  if (pxVar15 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    do {
      pxVar4 = pxVar15->nextCached;
      do {
        pxVar5 = pxVar15->next;
        pppxVar12 = pxVar15->keySeqs;
        if (pppxVar12 != (xmlSchemaPSVIIDCKeyPtr **)0x0) {
          iVar7 = pxVar15->sizeKeySeqs;
          if (0 < iVar7) {
            lVar14 = 0;
            do {
              if (pxVar15->keySeqs[lVar14] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
                (*xmlFree)(pxVar15->keySeqs[lVar14]);
                iVar7 = pxVar15->sizeKeySeqs;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < iVar7);
            pppxVar12 = pxVar15->keySeqs;
          }
          (*xmlFree)(pppxVar12);
        }
        pxVar13 = pxVar15->targets;
        if (pxVar13 != (xmlSchemaItemListPtr)0x0) {
          if ((pxVar15->idcType == 0x18) && (0 < pxVar13->nbItems)) {
            lVar14 = 0;
            do {
              pvVar6 = pxVar13->items[lVar14];
              (*xmlFree)(*(void **)((long)pvVar6 + 8));
              (*xmlFree)(pvVar6);
              lVar14 = lVar14 + 1;
              pxVar13 = pxVar15->targets;
            } while (lVar14 < pxVar13->nbItems);
          }
          if (pxVar13->items != (void **)0x0) {
            (*xmlFree)(pxVar13->items);
          }
          (*xmlFree)(pxVar13);
        }
        if (pxVar15->htab != (xmlHashTablePtr)0x0) {
          xmlHashFree(pxVar15->htab,xmlFreeIDCHashEntry);
        }
        (*xmlFree)(pxVar15);
        pxVar15 = pxVar5;
      } while (pxVar5 != (xmlSchemaIDCMatcherPtr)0x0);
      pxVar15 = pxVar4;
    } while (pxVar4 != (xmlSchemaIDCMatcherPtr)0x0);
    vctxt->idcMatcherCache = (xmlSchemaIDCMatcherPtr_conflict)0x0;
  }
  return;
}

Assistant:

static void
xmlSchemaPostRun(xmlSchemaValidCtxtPtr vctxt) {
    if (vctxt->xsiAssemble) {
	if (vctxt->schema != NULL) {
	    xmlSchemaFree(vctxt->schema);
	    vctxt->schema = NULL;
	}
    }
    xmlSchemaClearValidCtxt(vctxt);
}